

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall CVmObjTable::gc_trace_stack(CVmObjTable *this)

{
  vm_obj_id_t id;
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = (long)sp_ - (long)G_interpreter_X.super_CVmStack.arr_ >> 4;
  lVar1 = -8;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    if ((*(int *)((long)sp_ + lVar1 + -8) == 5) &&
       (id = *(vm_obj_id_t *)((long)&sp_->typ + lVar1), id != 0)) {
      add_to_gc_queue(this,id,2);
    }
    lVar1 = lVar1 + -0x10;
  }
  return;
}

Assistant:

void count_free()
    {
        ++cur_freed;
        ++tot_freed;
    }